

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O2

void __thiscall
cmFilePathChecksum::setupParentDirs
          (cmFilePathChecksum *this,string *currentSrcDir,string *currentBinDir,
          string *projectSrcDir,string *projectBinDir)

{
  string sStack_48;
  
  cmsys::SystemTools::GetRealPath(&sStack_48,currentSrcDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)this,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  cmsys::SystemTools::GetRealPath(&sStack_48,currentBinDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)(this->parentDirs + 1),(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  cmsys::SystemTools::GetRealPath(&sStack_48,projectSrcDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)(this->parentDirs + 2),(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  cmsys::SystemTools::GetRealPath(&sStack_48,projectBinDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)(this->parentDirs + 3),(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  std::__cxx11::string::assign((char *)&this->parentDirs[0].second);
  std::__cxx11::string::assign((char *)&this->parentDirs[1].second);
  std::__cxx11::string::assign((char *)&this->parentDirs[2].second);
  std::__cxx11::string::assign((char *)&this->parentDirs[3].second);
  return;
}

Assistant:

void cmFilePathChecksum::setupParentDirs(const std::string& currentSrcDir,
                                         const std::string& currentBinDir,
                                         const std::string& projectSrcDir,
                                         const std::string& projectBinDir)
{
  parentDirs[0].first = cmsys::SystemTools::GetRealPath(currentSrcDir);
  parentDirs[1].first = cmsys::SystemTools::GetRealPath(currentBinDir);
  parentDirs[2].first = cmsys::SystemTools::GetRealPath(projectSrcDir);
  parentDirs[3].first = cmsys::SystemTools::GetRealPath(projectBinDir);

  parentDirs[0].second = "CurrentSource";
  parentDirs[1].second = "CurrentBinary";
  parentDirs[2].second = "ProjectSource";
  parentDirs[3].second = "ProjectBinary";
}